

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.cc
# Opt level: O0

void __thiscall MutableS2ShapeIndex::InteriorTracker::InteriorTracker(InteriorTracker *this)

{
  S2CellId SVar1;
  InteriorTracker *this_local;
  
  this->is_active_ = false;
  Vector3<double>::Vector3(&this->a_);
  Origin();
  SVar1 = S2CellId::Begin(0x1e);
  (this->next_cellid_).id_ = SVar1.id_;
  S2EdgeCrosser::S2EdgeCrosser(&this->crosser_);
  std::vector<int,_std::allocator<int>_>::vector(&this->shape_ids_);
  std::vector<int,_std::allocator<int>_>::vector(&this->saved_ids_);
  return;
}

Assistant:

MutableS2ShapeIndex::InteriorTracker::InteriorTracker()
    : is_active_(false), b_(Origin()),
      next_cellid_(S2CellId::Begin(S2CellId::kMaxLevel)) {
}